

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * multiplicative_expression(dmr_C *C,token *token,expression **tree)

{
  int val;
  token *C_00;
  expression *peVar1;
  char *pcVar2;
  expression *peStack_40;
  int op;
  expression *right;
  expression *top;
  token *next;
  expression *left;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  next = (token *)0x0;
  left = (expression *)tree;
  tree_local = (expression **)token;
  token_local = (token *)C;
  top = (expression *)cast_expression(C,token,(expression **)&next);
  if (next != (token *)0x0) {
    while (((uint)*(undefined8 *)top & 0x3f) == 0x11) {
      peStack_40 = (expression *)0x0;
      val = *(int *)&top->ctype;
      if (((val != 0x2a) && (val != 0x2f)) && (val != 0x25)) break;
      right = dmrC_alloc_expression((dmr_C *)token_local,*(position *)top,5);
      peVar1 = (expression *)
               cast_expression((dmr_C *)token_local,(token *)top->pos,&stack0xffffffffffffffc0);
      C_00 = token_local;
      top = peVar1;
      if (peStack_40 == (expression *)0x0) {
        pcVar2 = dmrC_show_special((dmr_C *)token_local,val);
        dmrC_sparse_error((dmr_C *)C_00,*(position *)peVar1,
                          "No right hand side of \'%s\'-expression",pcVar2);
        break;
      }
      *(ushort *)right =
           *(ushort *)right & 0xff | ((*(ushort *)&next->pos & *(ushort *)peStack_40) >> 8 & 1) << 8
      ;
      right->op = val;
      (right->field_5).field_3.unop = (expression *)next;
      (right->field_5).field_2.string = (string *)peStack_40;
      next = (token *)right;
    }
  }
  *(token **)left = next;
  return (token *)top;
}

Assistant:

static struct token *multiplicative_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C, 
		token, tree, EXPR_BINOP, cast_expression,
		(op == '*') || (op == '/') || (op == '%')
	);
}